

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::c_formatter<spdlog::details::scoped_padder>::format
          (c_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  char *pcVar2;
  byte bVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  char *buf_ptr;
  basic_string_view<char> fmt;
  basic_string_view<char> fmt_00;
  basic_string_view<char> fmt_01;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_00;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args_01;
  scoped_padder p;
  ulong local_88 [3];
  buffer<char> local_70;
  memory_buf_t *local_50;
  scoped_padder local_48;
  
  scoped_padder::scoped_padder(&local_48,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pcVar2 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar4 = strlen(pcVar2);
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar2,pcVar2 + sVar4);
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = ' ';
  pcVar2 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar4 = strlen(pcVar2);
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,pcVar2,pcVar2 + sVar4);
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = ' ';
  local_70.capacity_ =
       (size_t)::fmt::v9::format_int::format_signed<int>((format_int *)&local_70,tm_time->tm_mday);
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,(char *)local_70.capacity_,
             (char *)((long)&local_70.size_ + 5));
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = ' ';
  uVar1 = tm_time->tm_hour;
  if ((ulong)uVar1 < 100) {
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    bVar3 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar1 + bVar3 * -10 | 0x30;
  }
  else {
    local_70.size_ = (dest->super_buffer<char>).size_;
    local_70._vptr_buffer = (_func_int **)&PTR_grow_001ce9b0;
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args.desc_ = 1;
    local_88[0] = (ulong)uVar1;
    local_70.capacity_ = local_70.size_;
    local_50 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_70,fmt,args,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = ':';
  uVar1 = tm_time->tm_min;
  if ((ulong)uVar1 < 100) {
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    bVar3 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar1 + bVar3 * -10 | 0x30;
  }
  else {
    local_70.size_ = (dest->super_buffer<char>).size_;
    local_70._vptr_buffer = (_func_int **)&PTR_grow_001ce9b0;
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args_00.desc_ = 1;
    local_88[0] = (ulong)uVar1;
    local_70.capacity_ = local_70.size_;
    local_50 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_70,fmt_00,args_00,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = ':';
  uVar1 = tm_time->tm_sec;
  if ((ulong)uVar1 < 100) {
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    bVar3 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = bVar3 | 0x30;
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (**(dest->super_buffer<char>)._vptr_buffer)(dest);
      sVar5 = (dest->super_buffer<char>).size_;
      uVar6 = sVar5 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar5] = (char)uVar1 + bVar3 * -10 | 0x30;
  }
  else {
    local_70.size_ = (dest->super_buffer<char>).size_;
    local_70._vptr_buffer = (_func_int **)&PTR_grow_001ce9b0;
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_88;
    args_01.desc_ = 1;
    local_88[0] = (ulong)uVar1;
    local_70.capacity_ = local_70.size_;
    local_50 = dest;
    ::fmt::v9::detail::vformat_to<char>(&local_70,fmt_01,args_01,(locale_ref)0x0);
  }
  sVar5 = (dest->super_buffer<char>).size_;
  uVar6 = sVar5 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest);
    sVar5 = (dest->super_buffer<char>).size_;
    uVar6 = sVar5 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar5] = ' ';
  local_70.capacity_ =
       (size_t)::fmt::v9::format_int::format_signed<int>
                         ((format_int *)&local_70,tm_time->tm_year + 0x76c);
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,(char *)local_70.capacity_,
             (char *)((long)&local_70.size_ + 5));
  scoped_padder::~scoped_padder(&local_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override
    {
        const size_t field_size = 24;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[static_cast<size_t>(tm_time.tm_wday)], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[static_cast<size_t>(tm_time.tm_mon)], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }